

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O1

void hwnet::http::HttpSession::onClose(Ptr *ss)

{
  _func_int **pp_Var1;
  any *paVar2;
  
  paVar2 = TCPSocket::GetUserData
                     ((ss->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  pp_Var1 = paVar2->content[1]._vptr_placeholder;
  if (pp_Var1[0x17] != (_func_int *)0x0) {
    (*pp_Var1[0x17])(pp_Var1 + 0x15,pp_Var1 + 0x15,3);
    pp_Var1[0x17] = (_func_int *)0x0;
    pp_Var1[0x18] = (_func_int *)0x0;
  }
  return;
}

Assistant:

void HttpSession::onClose(const TCPSocket::Ptr &ss) {
	auto session = any_cast<HttpSession*>(ss->GetUserData());
	session->onRequest = nullptr;
}